

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.cpp
# Opt level: O2

bool fs_rename(string_view from,string_view to)

{
  string_view path2;
  string_view path1;
  int iVar1;
  string_view fname;
  error_code ec;
  string_view to_local;
  string_view from_local;
  path local_70;
  path local_48;
  
  to_local._M_str = to._M_str;
  to_local._M_len = to._M_len;
  from_local._M_str = from._M_str;
  from_local._M_len = from._M_len;
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_70,&from_local,auto_format);
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_48,&to_local,auto_format);
  std::filesystem::rename(&local_70,&local_48,&ec);
  std::filesystem::__cxx11::path::~path(&local_48);
  std::filesystem::__cxx11::path::~path(&local_70);
  iVar1 = ec._M_value;
  if (ec._M_value != 0) {
    path1._M_str = from_local._M_str;
    path1._M_len = from_local._M_len;
    path2._M_str = to_local._M_str;
    path2._M_len = to_local._M_len;
    fname._M_str = "fs_rename";
    fname._M_len = 9;
    fs_print_error(path1,path2,fname,&ec);
  }
  return iVar1 == 0;
}

Assistant:

bool
fs_rename(std::string_view from, std::string_view to)
{
  // rename a file or directory
  // existing "to" is overwritten

  std::error_code ec;

#ifdef HAVE_CXX_FILESYSTEM
  // https://en.cppreference.com/w/cpp/filesystem/rename
  std::filesystem::rename(from, to, ec);
  if(!ec)
#else
  // https://en.cppreference.com/w/cpp/io/c/rename
  if(std::rename(from.data(), to.data()) == 0)
#endif
    return true;

  fs_print_error(from, to, __func__, ec);
  return false;

}